

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5CreateTable(Fts5Config *pConfig,char *zPost,char *zDefn,int bWithout,char **pzErr)

{
  int iVar1;
  char *pcVar2;
  char *zErr;
  
  zErr = (char *)0x0;
  pcVar2 = " WITHOUT ROWID";
  if (bWithout == 0) {
    pcVar2 = "";
  }
  iVar1 = fts5ExecPrintf(pConfig->db,&zErr,"CREATE TABLE %Q.\'%q_%q\'(%s)%s",pConfig->zDb,
                         pConfig->zName,zPost,zDefn,pcVar2);
  if (zErr != (char *)0x0) {
    pcVar2 = sqlite3_mprintf("fts5: error creating shadow table %q_%s: %s",pConfig->zName,zPost);
    *pzErr = pcVar2;
    sqlite3_free(zErr);
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5CreateTable(
  Fts5Config *pConfig,            /* FTS5 configuration */
  const char *zPost,              /* Shadow table to create (e.g. "content") */
  const char *zDefn,              /* Columns etc. for shadow table */
  int bWithout,                   /* True for without rowid */
  char **pzErr                    /* OUT: Error message */
){
  int rc;
  char *zErr = 0;

  rc = fts5ExecPrintf(pConfig->db, &zErr, "CREATE TABLE %Q.'%q_%q'(%s)%s",
      pConfig->zDb, pConfig->zName, zPost, zDefn, 
#ifndef SQLITE_FTS5_NO_WITHOUT_ROWID
      bWithout?" WITHOUT ROWID":
#endif
      ""
  );
  if( zErr ){
    *pzErr = sqlite3_mprintf(
        "fts5: error creating shadow table %q_%s: %s", 
        pConfig->zName, zPost, zErr
    );
    sqlite3_free(zErr);
  }

  return rc;
}